

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBrokerData.cpp
# Opt level: O1

void __thiscall
helics::NetworkBrokerData::checkAndUpdateBrokerAddress
          (NetworkBrokerData *this,string_view localAddress)

{
  string *this_00;
  InterfaceTypes IVar1;
  int iVar2;
  size_type __len1;
  char *__s;
  
  IVar1 = this->allowedType;
  if (IVar1 == IP) {
    this_00 = &this->brokerAddress;
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(this_00,"udp://*");
    if ((iVar2 == 0) ||
       (iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(this_00,"udp"), iVar2 == 0)) {
      checkAndUpdateBrokerAddress();
      return;
    }
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(this_00,"tcp://*");
    if ((iVar2 == 0) ||
       (iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(this_00,"tcp"), iVar2 == 0)) {
      checkAndUpdateBrokerAddress();
      return;
    }
    __s = "*";
LAB_0028343f:
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&this->brokerAddress,__s);
    if (iVar2 != 0) {
      return;
    }
  }
  else if (IVar1 == UDP) {
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&this->brokerAddress,"udp://*");
    if ((iVar2 != 0) &&
       (iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&this->brokerAddress,"*"), iVar2 != 0)) {
      __s = "udp";
      goto LAB_0028343f;
    }
  }
  else {
    if (IVar1 != TCP) {
      __len1 = (this->brokerAddress)._M_string_length;
      if (localAddress._M_len == 0 || __len1 != 0) {
        return;
      }
      goto LAB_0028348a;
    }
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&this->brokerAddress,"tcp://*");
    if ((iVar2 != 0) &&
       (iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&this->brokerAddress,"*"), iVar2 != 0)) {
      __s = "tcp";
      goto LAB_0028343f;
    }
  }
  __len1 = (this->brokerAddress)._M_string_length;
LAB_0028348a:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->brokerAddress,0,__len1,localAddress._M_str,localAddress._M_len);
  return;
}

Assistant:

void NetworkBrokerData::checkAndUpdateBrokerAddress(std::string_view localAddress)
{
    using gmlc::networking::InterfaceTypes;
    switch (allowedType) {
        case InterfaceTypes::TCP:
            if ((brokerAddress == "tcp://*") || (brokerAddress == "*") ||
                (brokerAddress == "tcp")) {  // the broker address can't use a wild card
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::UDP:
            if ((brokerAddress == "udp://*") || (brokerAddress == "*") ||
                (brokerAddress == "udp")) {  // the broker address can't use a wild card
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::IP:
            if ((brokerAddress == "udp://*") ||
                (brokerAddress == "udp")) {  // the broker address can't use a wild card
                brokerAddress = std::string("udp://");
                if (localAddress.compare(3, 3, "://") == 0) {
                    brokerAddress.append(localAddress.substr(6));
                } else {
                    brokerAddress.append(localAddress);
                }
            } else if ((brokerAddress == "tcp://*") ||
                       (brokerAddress == "tcp")) {  // the broker address can't use a wild card
                brokerAddress = std::string("tcp://");
                if (localAddress.compare(3, 3, "://") == 0) {
                    brokerAddress.append(localAddress.substr(6));
                } else {
                    brokerAddress.append(localAddress);
                }
            } else if (brokerAddress == "*") {
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::IPC:
        case InterfaceTypes::INPROC:
        default:
            if ((brokerAddress.empty()) && (!localAddress.empty())) {
                brokerAddress = localAddress;
            }
            break;
    }
}